

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ObjSetPhase(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint local_38;
  
  uVar10 = *(ulong *)pObj;
  uVar4 = uVar10 & 0x1fffffff;
  if (uVar4 == 0x1fffffff || (int)uVar10 < 0) {
    if ((int)uVar10 < 0 && (int)uVar4 != 0x1fffffff) {
      uVar10 = uVar10 & 0x7fffffffffffffff |
               (uVar10 << 0x22 ^ *(ulong *)(pObj + -uVar4)) & 0x8000000000000000;
    }
    else {
      uVar10 = uVar10 & 0x7fffffffffffffff;
    }
  }
  else {
    uVar1 = *(undefined8 *)(pObj + -uVar4);
    uVar6 = (uint)(uVar10 >> 0x1d) & 1;
    uVar7 = (uint)(uVar10 >> 0x20);
    uVar2 = *(undefined8 *)(pObj + -(ulong)(uVar7 & 0x1fffffff));
    uVar7 = uVar7 >> 0x1d & 1;
    iVar3 = Gia_ObjIsMux(p,pObj);
    uVar9 = -(int)((long)uVar2 >> 0x3f);
    local_38 = (uint)((ulong)uVar1 >> 0x3f);
    if (iVar3 == 0) {
      uVar6 = uVar6 ^ local_38;
      uVar7 = uVar7 ^ uVar9;
      iVar3 = Gia_ObjIsXor(pObj);
      if (iVar3 == 0) {
        uVar7 = uVar7 & uVar6;
      }
      else {
        uVar7 = uVar7 ^ uVar6;
      }
      uVar10 = *(ulong *)pObj & 0x7fffffffffffffff | (ulong)uVar7 << 0x3f;
    }
    else {
      pGVar5 = Gia_ObjFanin2(p,pObj);
      uVar1 = *(undefined8 *)pGVar5;
      iVar3 = Gia_ObjFaninC2(p,pObj);
      uVar4 = 0x8000000000000000;
      if (uVar6 == local_38) {
        uVar4 = 0;
      }
      iVar8 = -(int)((long)uVar1 >> 0x3f);
      if (iVar3 != iVar8) {
        uVar4 = 0;
      }
      uVar10 = 0x8000000000000000;
      if (uVar7 == uVar9) {
        uVar10 = uVar4;
      }
      if (iVar3 == iVar8) {
        uVar10 = uVar4;
      }
      uVar10 = *(ulong *)pObj & 0x7fffffffffffffff | uVar10;
    }
  }
  *(ulong *)pObj = uVar10;
  return;
}

Assistant:

void Gia_ObjSetPhase( Gia_Man_t * p, Gia_Obj_t * pObj )  
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fPhase0 = Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj);
        int fPhase1 = Gia_ObjPhase(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(pObj);
        if ( Gia_ObjIsMux(p, pObj) )
        {
            int fPhase2 = Gia_ObjPhase(Gia_ObjFanin2(p, pObj)) ^ Gia_ObjFaninC2(p, pObj);
            pObj->fPhase = (fPhase2 && fPhase1) || (!fPhase2 && fPhase0);
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->fPhase = fPhase0 ^ fPhase1;
        else
            pObj->fPhase = fPhase0 & fPhase1;
    }
    else if ( Gia_ObjIsCo(pObj) )
        pObj->fPhase = (Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj));
    else
        pObj->fPhase = 0;
}